

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeKernelSetCacheConfig(ze_kernel_handle_t hKernel,ze_cache_config_flags_t flags)

{
  ze_pfnKernelSetCacheConfig_t pfnSetCacheConfig;
  dditable_t *dditable;
  ze_result_t result;
  ze_cache_config_flags_t flags_local;
  ze_kernel_handle_t hKernel_local;
  
  if (*(code **)(*(long *)(hKernel + 8) + 0x560) == (code *)0x0) {
    hKernel_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hKernel_local._4_4_ =
         (**(code **)(*(long *)(hKernel + 8) + 0x560))(*(undefined8 *)hKernel,flags);
  }
  return hKernel_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetCacheConfig(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        ze_cache_config_flags_t flags                   ///< [in] cache configuration.
                                                        ///< must be 0 (default configuration) or a valid combination of ::ze_cache_config_flag_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_kernel_object_t*>( hKernel )->dditable;
        auto pfnSetCacheConfig = dditable->ze.Kernel.pfnSetCacheConfig;
        if( nullptr == pfnSetCacheConfig )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hKernel = reinterpret_cast<ze_kernel_object_t*>( hKernel )->handle;

        // forward to device-driver
        result = pfnSetCacheConfig( hKernel, flags );

        return result;
    }